

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench.cpp
# Opt level: O0

void lru_cache_bench_test<1000000ul,1ul,100000ul,std::__cxx11::string,std::__cxx11::string,(cappuccino::thread_safe)0,(batch_insert)0>
               (void)

{
  bool bVar1;
  ostream *poVar2;
  thread *worker;
  iterator __end1;
  iterator __begin1;
  vector<std::thread,_std::allocator<std::thread>_> *__range1;
  size_t i;
  type func;
  vector<std::thread,_std::allocator<std::thread>_> workers;
  char *value_name;
  char *key_name;
  lru_cache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)0>
  local_d8 [8];
  lru_cache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>
  cache;
  mutex cout_lock;
  
  cache.m_lru_end._M_node = (_List_node_base *)0x0;
  std::mutex::mutex((mutex *)&cache.m_lru_end);
  cappuccino::
  lru_cache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)0>
  ::lru_cache(local_d8,100000,1.0);
  std::operator<<((ostream *)&std::cout,"LRU ");
  std::operator<<((ostream *)&std::cout,"thread_safe::no ");
  std::operator<<((ostream *)&std::cout,"Individual ");
  poVar2 = std::operator<<((ostream *)&std::cout,"<");
  poVar2 = std::operator<<(poVar2,"string");
  poVar2 = std::operator<<(poVar2,", ");
  poVar2 = std::operator<<(poVar2,"string");
  std::operator<<(poVar2,"> ");
  std::vector<std::thread,_std::allocator<std::thread>_>::vector
            ((vector<std::thread,_std::allocator<std::thread>_> *)&func.cout_lock);
  std::vector<std::thread,_std::allocator<std::thread>_>::reserve
            ((vector<std::thread,_std::allocator<std::thread>_> *)&func.cout_lock,1);
  i = (size_t)local_d8;
  func.cache = (lru_cache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>
                *)&cache.m_lru_end;
  bVar1 = false;
  while (!bVar1) {
    std::vector<std::thread,std::allocator<std::thread>>::
    emplace_back<lru_cache_bench_test<1000000ul,1ul,100000ul,std::__cxx11::string,std::__cxx11::string,(cappuccino::thread_safe)0,(batch_insert)0>()::_lambda()_1_&>
              ((vector<std::thread,std::allocator<std::thread>> *)&func.cout_lock,(type *)&i);
    bVar1 = true;
  }
  __end1 = std::vector<std::thread,_std::allocator<std::thread>_>::begin
                     ((vector<std::thread,_std::allocator<std::thread>_> *)&func.cout_lock);
  worker = (thread *)
           std::vector<std::thread,_std::allocator<std::thread>_>::end
                     ((vector<std::thread,_std::allocator<std::thread>_> *)&func.cout_lock);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>
                                *)&worker);
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>::
    operator*(&__end1);
    std::thread::join();
    __gnu_cxx::
    __normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>::
    operator++(&__end1);
  }
  std::operator<<((ostream *)&std::cout,"\n");
  std::vector<std::thread,_std::allocator<std::thread>_>::~vector
            ((vector<std::thread,_std::allocator<std::thread>_> *)&func.cout_lock);
  cappuccino::
  lru_cache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)0>
  ::~lru_cache(local_d8);
  return;
}

Assistant:

static auto lru_cache_bench_test() -> void
{
    std::mutex                                        cout_lock{};
    lru_cache<key_type, value_type, thread_safe_type> cache{cache_size};

    std::cout << "LRU ";
    if constexpr (thread_safe_type == thread_safe::yes)
    {
        std::cout << "thread_safe::yes ";
    }
    else
    {
        std::cout << "thread_safe::no ";
    }

    auto key_name = "string";
    if constexpr (std::is_same<key_type, uint64_t>::value)
    {
        key_name = "uint64";
    }
    auto value_name = "string";
    if constexpr (std::is_same<value_type, uint64_t>::value)
    {
        value_name = "uint64";
    }

    if constexpr (batch_type == batch_insert::no)
    {
        std::cout << "Individual ";
    }
    else if constexpr (batch_type == batch_insert::yes)
    {
        std::cout << "Batch ";
    }
    std::cout << "<" << key_name << ", " << value_name << "> ";

    std::vector<std::thread> workers;
    workers.reserve(worker_count);

    auto func = [&]() mutable -> void
    {
        size_t worker_iterations = iterations / worker_count;

        std::chrono::milliseconds insert_elapsed{0};
        std::chrono::milliseconds find_elapsed{0};

        auto start = std::chrono::steady_clock::now();

        if constexpr (batch_type == batch_insert::no)
        {
            for (size_t i = 0; i < worker_iterations; ++i)
            {
                if constexpr (
                    std::is_same<key_type, std::string>::value && std::is_same<value_type, std::string>::value)
                {
                    auto s = to_string(i);
                    cache.insert(s, s);
                }
                else if constexpr (
                    std::is_same<key_type, std::string>::value && std::is_same<value_type, uint64_t>::value)
                {
                    cache.insert(to_string(i), i);
                }
                else if constexpr (std::is_same<key_type, uint64_t>::value && std::is_same<value_type, uint64_t>::value)
                {
                    cache.insert(i, i);
                }
                else if constexpr (
                    std::is_same<key_type, uint64_t>::value && std::is_same<value_type, std::string>::value)
                {
                    cache.insert(i, to_string(i));
                }
                else
                {
                    throw std::runtime_error("invalid type parameters");
                }
            }
        }
        else
        {
            std::vector<std::pair<key_type, value_type>> data;
            data.reserve(worker_iterations);

            for (size_t i = 0; i < worker_iterations; ++i)
            {
                if constexpr (
                    std::is_same<key_type, std::string>::value && std::is_same<value_type, std::string>::value)
                {
                    auto s = to_string(i);
                    data.emplace_back(s, s);
                }
                else if constexpr (
                    std::is_same<key_type, std::string>::value && std::is_same<value_type, uint64_t>::value)
                {
                    data.emplace_back(to_string(i), i);
                }
                else if constexpr (std::is_same<key_type, uint64_t>::value && std::is_same<value_type, uint64_t>::value)
                {
                    data.emplace_back(i, i);
                }
                else if constexpr (
                    std::is_same<key_type, uint64_t>::value && std::is_same<value_type, std::string>::value)
                {
                    data.emplace_back(i, to_string(i));
                }
                else
                {
                    throw std::runtime_error("invalid type parameters");
                }
            }

            cache.insert_range(std::move(data));
        }

        auto stop = std::chrono::steady_clock::now();

        insert_elapsed = std::chrono::duration_cast<std::chrono::milliseconds>(stop - start);

        start = std::chrono::steady_clock::now();

        if constexpr (batch_type == batch_insert::no)
        {
            for (size_t i = 0; i < worker_iterations; ++i)
            {
                if constexpr (std::is_same<key_type, std::string>::value)
                {
                    cache.find(to_string(i));
                }
                else if constexpr (std::is_same<key_type, uint64_t>::value)
                {
                    cache.find(i);
                }
                else
                {
                    throw std::runtime_error("invalid type parameters");
                }
            }
        }
        else
        {
            std::unordered_map<key_type, std::optional<value_type>> data;
            data.reserve(worker_iterations);

            for (size_t i = 0; i < worker_iterations; ++i)
            {
                if constexpr (std::is_same<key_type, std::string>::value)
                {
                    data.emplace(to_string(i), std::optional<value_type>{});
                }
                else if constexpr (std::is_same<key_type, uint64_t>::value)
                {
                    data.emplace(i, std::optional<value_type>{});
                }
                else
                {
                    throw std::runtime_error("invalid type parameters");
                }
            }

            cache.find_range_fill(data);
        }

        stop = std::chrono::steady_clock::now();

        find_elapsed = std::chrono::duration_cast<std::chrono::milliseconds>(stop - start);

        std::lock_guard guard{cout_lock};
        std::cout << "[" << insert_elapsed.count() << ", " << find_elapsed.count() << "] ";
    };

    for (size_t i = 0; i < worker_count; ++i)
    {
        workers.emplace_back(func);
    }

    for (auto& worker : workers)
    {
        worker.join();
    }

    std::cout << "\n";
}